

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void printCompression(Compression c)

{
  char *pcVar1;
  
  switch(c) {
  case NO_COMPRESSION:
    pcVar1 = "none";
    break;
  case RLE_COMPRESSION:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"run-length encoding",0x13);
    return;
  case ZIPS_COMPRESSION:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"zip, individual scanlines",0x19);
    return;
  case ZIP_COMPRESSION:
    pcVar1 = "zip, multi-scanline blocks";
    goto LAB_00103596;
  case PIZ_COMPRESSION:
    pcVar1 = "piz";
    goto LAB_00103572;
  case PXR24_COMPRESSION:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pxr24",5);
    return;
  case B44_COMPRESSION:
    pcVar1 = "b44";
LAB_00103572:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,3);
    return;
  case B44A_COMPRESSION:
    pcVar1 = "b44a";
    break;
  case DWAA_COMPRESSION:
    pcVar1 = "dwa, small scanline blocks";
LAB_00103596:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,0x1a);
    return;
  case DWAB_COMPRESSION:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"dwa, medium scanline blocks",0x1b);
    return;
  default:
    std::ostream::operator<<((ostream *)&std::cout,c);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,4);
  return;
}

Assistant:

void
printCompression (Compression c)
{
    switch (c)
    {
        case NO_COMPRESSION: cout << "none"; break;

        case RLE_COMPRESSION: cout << "run-length encoding"; break;

        case ZIPS_COMPRESSION: cout << "zip, individual scanlines"; break;

        case ZIP_COMPRESSION: cout << "zip, multi-scanline blocks"; break;

        case PIZ_COMPRESSION: cout << "piz"; break;

        case PXR24_COMPRESSION: cout << "pxr24"; break;

        case B44_COMPRESSION: cout << "b44"; break;

        case B44A_COMPRESSION: cout << "b44a"; break;

        case DWAA_COMPRESSION: cout << "dwa, small scanline blocks"; break;

        case DWAB_COMPRESSION: cout << "dwa, medium scanline blocks"; break;

        default: cout << int (c); break;
    }
}